

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

size_t lddmc_nodecount_mark(MDD mdd)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar3 = 0;
  while( true ) {
    if (mdd < 2) {
      return sVar3;
    }
    lVar4 = mdd * 0x10;
    puVar1 = nodes->data;
    if ((*(ulong *)(puVar1 + lVar4) & 1) != 0) break;
    *(ulong *)(puVar1 + lVar4) = *(ulong *)(puVar1 + lVar4) | 1;
    sVar2 = lddmc_nodecount_mark(*(ulong *)(puVar1 + lVar4 + 8) >> 0x11);
    mdd = *(ulong *)(puVar1 + lVar4) >> 1 & 0x7fffffffffff;
    sVar3 = sVar3 + 1 + sVar2;
  }
  return sVar3;
}

Assistant:

static size_t
lddmc_nodecount_mark(MDD mdd)
{
    if (mdd <= lddmc_true) return 0;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) return 0;
    mddnode_setmark(n, 1);
    return 1 + lddmc_nodecount_mark(mddnode_getdown(n)) + lddmc_nodecount_mark(mddnode_getright(n));
}